

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkeletonReader.cpp
# Opt level: O0

StepStatus __thiscall
adios2::core::engine::SkeletonReader::BeginStep
          (SkeletonReader *this,StepMode mode,float timeoutSeconds)

{
  ostream *poVar1;
  long in_RDI;
  StepStatus local_4;
  
  *(int *)(in_RDI + 200) = *(int *)(in_RDI + 200) + 1;
  if (*(int *)(in_RDI + 0xc0) == 5) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Skeleton Reader ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0xc4));
    poVar1 = std::operator<<(poVar1,"   BeginStep() new step ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 200));
    std::operator<<(poVar1,"\n");
  }
  if (*(int *)(in_RDI + 200) == 2) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Skeleton Reader ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0xc4));
    std::operator<<(poVar1,"   forcefully returns End of Stream at this step\n");
    local_4 = EndOfStream;
  }
  else {
    local_4 = OK;
  }
  return local_4;
}

Assistant:

StepStatus SkeletonReader::BeginStep(const StepMode mode, const float timeoutSeconds)
{
    // step info should be received from the writer side in BeginStep()
    // so this forced increase should not be here
    ++m_CurrentStep;

    if (m_Verbosity == 5)
    {
        std::cout << "Skeleton Reader " << m_ReaderRank << "   BeginStep() new step "
                  << m_CurrentStep << "\n";
    }

    // If we reach the end of stream (writer is gone or explicitly tells the
    // reader)
    // we return EndOfStream to the reader application
    if (m_CurrentStep == 2)
    {
        std::cout << "Skeleton Reader " << m_ReaderRank
                  << "   forcefully returns End of Stream at this step\n";

        return StepStatus::EndOfStream;
    }

    // We should block until a new step arrives or reach the timeout

    // m_IO Variables and Attributes should be defined at this point
    // so that the application can inquire them and start getting data

    return StepStatus::OK;
}